

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

int link_set_max_message_size(LINK_HANDLE link,uint64_t max_message_size)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x42a;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_set_max_message_size",0x429,1,"NULL link");
    }
  }
  else {
    link->max_message_size = max_message_size;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int link_set_max_message_size(LINK_HANDLE link, uint64_t max_message_size)
{
    int result;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else
    {
        link->max_message_size = max_message_size;
        result = 0;
    }

    return result;
}